

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall icu_63::number::impl::DecimalQuantity::readIntToBcd(DecimalQuantity *this,int32_t n)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  
  bVar1 = 0;
  iVar2 = 0;
  uVar3 = 0;
  for (; n != 0; n = n / 10) {
    uVar3 = uVar3 >> 4 | (ulong)(long)n % 10 << 0x3c;
    bVar1 = bVar1 - 4;
    iVar2 = iVar2 + 1;
  }
  (this->fBCD).bcdLong = uVar3 >> (bVar1 & 0x3f);
  this->scale = 0;
  this->precision = iVar2;
  return;
}

Assistant:

void DecimalQuantity::readIntToBcd(int32_t n) {
    U_ASSERT(n != 0);
    // ints always fit inside the long implementation.
    uint64_t result = 0L;
    int i = 16;
    for (; n != 0; n /= 10, i--) {
        result = (result >> 4) + ((static_cast<uint64_t>(n) % 10) << 60);
    }
    U_ASSERT(!usingBytes);
    fBCD.bcdLong = result >> (i * 4);
    scale = 0;
    precision = 16 - i;
}